

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_20d90e::cmQtAutoMocUicT::JobT::RunProcess
          (JobT *this,GenT genType,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *infoMessage)

{
  bool bVar1;
  void *pvVar2;
  char *__s;
  string_view message;
  char local_e1;
  ProcessResultT *local_e0;
  string local_d8;
  string local_b8;
  cmAlphaNum local_98;
  cmAlphaNum local_60;
  
  pvVar2 = ((this->super_JobT).Pool_)->UserData_;
  if (*(int *)((long)pvVar2 + 0x38) == 0) goto LAB_001a2709;
  if (infoMessage == (string *)0x0) {
    local_98.View_._M_len = 0;
    local_98.View_._M_str = (pointer)0x0;
LAB_001a2685:
    __s = "";
  }
  else {
    local_98.View_._M_str = (infoMessage->_M_dataplus)._M_p;
    local_98.View_._M_len = infoMessage->_M_string_length;
    if (local_98.View_._M_len == 0) goto LAB_001a2685;
    __s = "\n";
    if (local_98.View_._M_str[local_98.View_._M_len - 1] == '\n') {
      __s = "";
    }
  }
  local_e0 = result;
  local_60.View_._M_len = strlen(__s);
  local_60.View_._M_str = __s;
  cmQtAutoGen::QuotedCommand(&local_b8,command);
  local_e1 = '\n';
  cmStrCat<std::__cxx11::string,char>(&local_d8,&local_98,&local_60,&local_b8,&local_e1);
  message._M_str = local_d8._M_dataplus._M_p;
  message._M_len = local_d8._M_string_length;
  cmQtAutoGenerator::Logger::Info((Logger *)((long)pvVar2 + 0x10),genType,message);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  pvVar2 = ((this->super_JobT).Pool_)->UserData_;
  result = local_e0;
LAB_001a2709:
  bVar1 = cmWorkerPool::JobT::RunProcess
                    (&this->super_JobT,result,command,(string *)((long)pvVar2 + 0x138));
  return bVar1;
}

Assistant:

bool cmQtAutoMocUicT::JobT::RunProcess(GenT genType,
                                       cmWorkerPool::ProcessResultT& result,
                                       std::vector<std::string> const& command,
                                       std::string* infoMessage)
{
  // Log command
  if (this->Log().Verbose()) {
    cm::string_view info;
    if (infoMessage != nullptr) {
      info = *infoMessage;
    }
    this->Log().Info(
      genType,
      cmStrCat(info, info.empty() || cmHasSuffix(info, '\n') ? "" : "\n",
               QuotedCommand(command), '\n'));
  }
  // Run command
  return this->cmWorkerPool::JobT::RunProcess(
    result, command, this->BaseConst().AutogenBuildDir);
}